

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrolling_group.cpp
# Opt level: O3

void scroll_group_general_undo_redo
               (Am_Object *command_obj,bool undo,bool selective,Am_Slot_Key slot)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Object *this;
  Am_Object scroll_group;
  Am_Object scroll_bar;
  Am_Value old_value;
  Am_Value new_value;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Value local_48;
  Am_Value local_38;
  
  local_38.type = 0;
  local_38.value.wrapper_value = (Am_Wrapper *)0x0;
  local_48.type = 0;
  local_48.value.wrapper_value = (Am_Wrapper *)0x0;
  local_58.data = (Am_Object_Data *)0x0;
  local_60.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(command_obj,0x170,0);
  Am_Object::operator=(&local_58,pAVar2);
  Am_Object::Get_Object(&local_50,(Am_Slot_Key)&local_58,10);
  Am_Object::operator=(&local_60,&local_50);
  Am_Object::~Am_Object(&local_50);
  bVar1 = Am_Object::Valid(&local_60);
  if (bVar1) {
    this = &local_58;
    if (!selective) {
      this = command_obj;
    }
    pAVar2 = Am_Object::Get(this,0x169,1);
    Am_Value::operator=(&local_38,pAVar2);
    pAVar2 = Am_Object::Get(command_obj,(ushort)undo + (ushort)undo * 2 + 0x169,1);
    Am_Value::operator=(&local_48,pAVar2);
    Am_Object::Set(command_obj,0x16c,&local_38,0);
    Am_Object::Set(command_obj,0x169,&local_48,0);
    bVar1 = Am_Object::Valid(&local_60);
    if (bVar1) {
      Am_Object::Set(&local_60,slot,&local_48,0);
    }
  }
  Am_Object::~Am_Object(&local_60);
  Am_Object::~Am_Object(&local_58);
  Am_Value::~Am_Value(&local_48);
  Am_Value::~Am_Value(&local_38);
  return;
}

Assistant:

void
scroll_group_general_undo_redo(Am_Object command_obj, bool undo, bool selective,
                               Am_Slot_Key slot)
{
  Am_Value new_value, old_value;
  Am_Object scroll_bar, scroll_group;
  scroll_bar = command_obj.Get(Am_SAVED_OLD_OWNER);
  scroll_group = scroll_bar.Get_Owner();
  if (scroll_group.Valid()) {

    if (selective) // then get current value from the scroll_bar
      new_value = scroll_bar.Peek(Am_VALUE);
    else // get current value from the command_obj
      new_value = command_obj.Peek(Am_VALUE);

    if (undo)
      old_value = command_obj.Peek(Am_OLD_VALUE);
    else // repeat
      old_value = command_obj.Peek(Am_VALUE);

    command_obj.Set(Am_OLD_VALUE, new_value);
    command_obj.Set(Am_VALUE, old_value);
    //also set scroll group
    if (scroll_group.Valid()) {
      scroll_group.Set(slot, old_value);
    }
  }
}